

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void idct64_stage4_high32_avx2(__m256i *x,int32_t *cospi,__m256i _r,int8_t cos_bit)

{
  __m256i cospi_m12_m52;
  __m256i cospi_p12_p52;
  __m256i cospi_m52_p12;
  __m256i cospi_m44_m20;
  __m256i cospi_p44_p20;
  __m256i cospi_m20_p44;
  __m256i cospi_m28_m36;
  __m256i cospi_p28_p36;
  __m256i cospi_m36_p28;
  __m256i cospi_m60_m04;
  __m256i cospi_p60_p04;
  __m256i cospi_m04_p60;
  undefined4 uVar1;
  undefined8 in_stack_fffffffffffffe10;
  int32_t in_stack_ffffffffffffffd4;
  __m256i in_stack_ffffffffffffffd8;
  
  uVar1 = (undefined4)in_stack_fffffffffffffe10;
  pair_set_w16_epi16((int16_t)((ulong)in_stack_fffffffffffffe10 >> 0x10),
                     (int16_t)in_stack_fffffffffffffe10);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  pair_set_w16_epi16((int16_t)((uint)uVar1 >> 0x10),(int16_t)uVar1);
  btf_16_w16_avx2(stack0x00000038,(__m256i)stack0x00000018,(__m256i *)cospi_m12_m52[2],
                  (__m256i *)cospi_m12_m52[1],in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  btf_16_w16_avx2(stack0x00000038,(__m256i)stack0x00000018,(__m256i *)cospi_m12_m52[2],
                  (__m256i *)cospi_m12_m52[1],in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  btf_16_w16_avx2(stack0x00000038,(__m256i)stack0x00000018,(__m256i *)cospi_m12_m52[2],
                  (__m256i *)cospi_m12_m52[1],in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  btf_16_w16_avx2(stack0x00000038,(__m256i)stack0x00000018,(__m256i *)cospi_m12_m52[2],
                  (__m256i *)cospi_m12_m52[1],in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  btf_16_w16_avx2(stack0x00000038,(__m256i)stack0x00000018,(__m256i *)cospi_m12_m52[2],
                  (__m256i *)cospi_m12_m52[1],in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  btf_16_w16_avx2(stack0x00000038,(__m256i)stack0x00000018,(__m256i *)cospi_m12_m52[2],
                  (__m256i *)cospi_m12_m52[1],in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  btf_16_w16_avx2(stack0x00000038,(__m256i)stack0x00000018,(__m256i *)cospi_m12_m52[2],
                  (__m256i *)cospi_m12_m52[1],in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  btf_16_w16_avx2(stack0x00000038,(__m256i)stack0x00000018,(__m256i *)cospi_m12_m52[2],
                  (__m256i *)cospi_m12_m52[1],in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  return;
}

Assistant:

static inline void idct64_stage4_high32_avx2(__m256i *x, const int32_t *cospi,
                                             const __m256i _r, int8_t cos_bit) {
  (void)cos_bit;
  const __m256i cospi_m04_p60 = pair_set_w16_epi16(-cospi[4], cospi[60]);
  const __m256i cospi_p60_p04 = pair_set_w16_epi16(cospi[60], cospi[4]);
  const __m256i cospi_m60_m04 = pair_set_w16_epi16(-cospi[60], -cospi[4]);
  const __m256i cospi_m36_p28 = pair_set_w16_epi16(-cospi[36], cospi[28]);
  const __m256i cospi_p28_p36 = pair_set_w16_epi16(cospi[28], cospi[36]);
  const __m256i cospi_m28_m36 = pair_set_w16_epi16(-cospi[28], -cospi[36]);
  const __m256i cospi_m20_p44 = pair_set_w16_epi16(-cospi[20], cospi[44]);
  const __m256i cospi_p44_p20 = pair_set_w16_epi16(cospi[44], cospi[20]);
  const __m256i cospi_m44_m20 = pair_set_w16_epi16(-cospi[44], -cospi[20]);
  const __m256i cospi_m52_p12 = pair_set_w16_epi16(-cospi[52], cospi[12]);
  const __m256i cospi_p12_p52 = pair_set_w16_epi16(cospi[12], cospi[52]);
  const __m256i cospi_m12_m52 = pair_set_w16_epi16(-cospi[12], -cospi[52]);
  btf_16_w16_avx2(cospi_m04_p60, cospi_p60_p04, &x[33], &x[62], _r, cos_bit);
  btf_16_w16_avx2(cospi_m60_m04, cospi_m04_p60, &x[34], &x[61], _r, cos_bit);
  btf_16_w16_avx2(cospi_m36_p28, cospi_p28_p36, &x[37], &x[58], _r, cos_bit);
  btf_16_w16_avx2(cospi_m28_m36, cospi_m36_p28, &x[38], &x[57], _r, cos_bit);
  btf_16_w16_avx2(cospi_m20_p44, cospi_p44_p20, &x[41], &x[54], _r, cos_bit);
  btf_16_w16_avx2(cospi_m44_m20, cospi_m20_p44, &x[42], &x[53], _r, cos_bit);
  btf_16_w16_avx2(cospi_m52_p12, cospi_p12_p52, &x[45], &x[50], _r, cos_bit);
  btf_16_w16_avx2(cospi_m12_m52, cospi_m52_p12, &x[46], &x[49], _r, cos_bit);
}